

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O0

void __thiscall GNB::GNB(GNB *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *local_e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_9f;
  allocator local_9e;
  allocator local_9d [20];
  allocator local_89;
  string *local_88;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  GNB *local_10;
  GNB *this_local;
  
  this->_vptr_GNB = (_func_int **)&PTR__GNB_00112d88;
  local_9f = 1;
  local_88 = local_80;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"left",&local_89);
  local_88 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"keep",local_9d);
  local_88 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"right",&local_9e);
  local_9f = 0;
  local_20 = (iterator)local_80;
  local_18 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_a0);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->possible_labels,__l,&local_a0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_a0);
  local_e8 = (string *)&local_20;
  do {
    local_e8 = local_e8 + -0x20;
    std::__cxx11::string::~string(local_e8);
  } while (local_e8 != local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e);
  std::allocator<char>::~allocator((allocator<char> *)local_9d);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

GNB::GNB()
{
  /**
   * TODO: Initialize GNB, if necessary. May depend on your implementation.
   */
}